

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O1

void __thiscall Imf_3_2::SampleCountChannel::endEdit(SampleCountChannel *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  size_t *psVar4;
  DeepImageLevel *this_00;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  if ((this->super_ImageChannel)._numPixels != 0) {
    puVar2 = this->_numSamples;
    puVar3 = this->_sampleListSizes;
    psVar4 = this->_sampleListPositions;
    uVar6 = 0;
    do {
      uVar1 = puVar2[uVar6];
      uVar7 = 0;
      if (uVar1 != 0) {
        uVar5 = 1;
        do {
          uVar7 = uVar5;
          uVar5 = uVar7 * 2;
        } while (uVar7 < uVar1);
      }
      puVar3[uVar6] = uVar7;
      psVar4[uVar6] = this->_totalSamplesOccupied;
      this->_totalNumSamples = this->_totalNumSamples + (ulong)puVar2[uVar6];
      this->_totalSamplesOccupied = this->_totalSamplesOccupied + (ulong)uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->super_ImageChannel)._numPixels);
  }
  this_00 = (DeepImageLevel *)(this->super_ImageChannel)._level;
  this->_sampleBufferSize = (this->_totalSamplesOccupied >> 1) + this->_totalSamplesOccupied;
  DeepImageLevel::initializeSampleLists(this_00);
  return;
}

Assistant:

void
SampleCountChannel::endEdit ()
{
    try
    {
        _totalNumSamples      = 0;
        _totalSamplesOccupied = 0;

        for (size_t i = 0; i < numPixels (); ++i)
        {
            _sampleListSizes[i]     = roundListSizeUp (_numSamples[i]);
            _sampleListPositions[i] = _totalSamplesOccupied;
            _totalNumSamples += _numSamples[i];
            _totalSamplesOccupied += _sampleListSizes[i];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().initializeSampleLists ();
    }
    catch (...)
    {
        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}